

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O3

void __thiscall wabt::ArrayType::~ArrayType(ArrayType *this)

{
  pointer pcVar1;
  
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__ArrayType_0019c7f8;
  pcVar1 = (this->field).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->field).name.field_2) {
    operator_delete(pcVar1);
  }
  (this->super_TypeEntry)._vptr_TypeEntry = (_func_int **)&PTR__TypeEntry_0019c7a0;
  pcVar1 = (this->super_TypeEntry).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_TypeEntry).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

static bool classof(const TypeEntry* entry) {
    return entry->kind() == TypeEntryKind::Array;
  }